

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator>
* __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
equal_range<google::protobuf::internal::(anonymous_namespace)::CustomStringView>
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator>
           *__return_storage_ptr__,
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *this,key_arg<google::protobuf::internal::(anonymous_namespace)::CustomStringView> *key)

{
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator>
  *ppVar1;
  uint uVar2;
  size_t in_RCX;
  ulong uVar3;
  uint uVar4;
  NodeBase *pNVar5;
  NodeAndBucket NVar6;
  ViewType k;
  
  k._M_str = (char *)key;
  k._M_len = in_RCX;
  NVar6 = protobuf::internal::
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::FindHelper(&this->
                        super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ,k);
  ppVar1 = (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator>
            *)NVar6.node;
  uVar4 = NVar6.bucket;
  uVar2 = uVar4;
  if (ppVar1 == (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator>
                 *)0x0) {
    ppVar1 = (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator>
              *)0x0;
    pNVar5 = (NodeBase *)0x0;
  }
  else {
    pNVar5 = (ppVar1->first).super_UntypedMapIterator.node_;
    if (pNVar5 == (NodeBase *)0x0) {
      uVar3 = NVar6._8_8_ & 0xffffffff;
      do {
        uVar2 = (int)uVar3 + 1;
        uVar3 = (ulong)uVar2;
        if ((this->
            super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).super_UntypedMapBase.num_buckets_ <= uVar2) {
          pNVar5 = (NodeBase *)0x0;
          uVar2 = 0;
          break;
        }
        pNVar5 = (this->
                 super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).super_UntypedMapBase.table_[uVar2];
      } while (pNVar5 == (NodeBase *)0x0);
    }
  }
  (__return_storage_ptr__->first).super_UntypedMapIterator.node_ = (NodeBase *)ppVar1;
  (__return_storage_ptr__->first).super_UntypedMapIterator.m_ = (UntypedMapBase *)this;
  (__return_storage_ptr__->first).super_UntypedMapIterator.bucket_index_ = uVar4;
  (__return_storage_ptr__->second).super_UntypedMapIterator.node_ = pNVar5;
  (__return_storage_ptr__->second).super_UntypedMapIterator.m_ = (UntypedMapBase *)this;
  (__return_storage_ptr__->second).super_UntypedMapIterator.bucket_index_ = uVar2;
  return ppVar1;
}

Assistant:

std::pair<iterator, iterator> equal_range(const key_arg<K>& key)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    iterator it = find(key);
    if (it == end()) {
      return std::pair<iterator, iterator>(it, it);
    } else {
      iterator begin = it++;
      return std::pair<iterator, iterator>(begin, it);
    }
  }